

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void PlayerLogCallback(void *userParam,PlayerBase *player,UINT8 level,UINT8 srcType,char *srcTag,
                      char *message)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (logLevel < level) {
    return;
  }
  if (5 < level) {
    level = 0;
  }
  iVar1 = (*player->_vptr_PlayerBase[3])(player);
  if (srcType != '\0') {
    printf("[%s] %s %s: %s",
           *(undefined8 *)(LogLevel2Str(unsigned_char)::LVL_NAMES + (ulong)level * 8),
           CONCAT44(extraout_var,iVar1),srcTag,message);
    return;
  }
  printf("[%s] %s: %s",*(undefined8 *)(LogLevel2Str(unsigned_char)::LVL_NAMES + (ulong)level * 8),
         CONCAT44(extraout_var,iVar1),message);
  return;
}

Assistant:

static void PlayerLogCallback(void* userParam, PlayerBase* player, UINT8 level, UINT8 srcType,
	const char* srcTag, const char* message)
{
	if (level > logLevel)
		return;	// don't print messages with higher verbosity than current log level
	if (srcType == PLRLOGSRC_PLR)
		printf("[%s] %s: %s", LogLevel2Str(level), player->GetPlayerName(), message);
	else
		printf("[%s] %s %s: %s", LogLevel2Str(level), player->GetPlayerName(), srcTag, message);
	return;
}